

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ph-opt.cpp
# Opt level: O0

string * getDefaultOutputFileName(string *__return_storage_ptr__,string *TgtLang)

{
  int iVar1;
  char *pcVar2;
  allocator local_33;
  allocator local_32;
  allocator local_31;
  allocator local_30;
  allocator local_2f;
  allocator local_2e;
  allocator local_2d [20];
  allocator local_19;
  string *local_18;
  string *TgtLang_local;
  
  local_18 = TgtLang;
  TgtLang_local = __return_storage_ptr__;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  iVar1 = strcmp(pcVar2,"OPENMP");
  if (iVar1 == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,"a.cpp",&local_19);
    std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    pcVar2 = (char *)std::__cxx11::string::c_str();
    iVar1 = strcmp(pcVar2,"NUMPY");
    if (iVar1 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)__return_storage_ptr__,"a.py",local_2d);
      std::allocator<char>::~allocator((allocator<char> *)local_2d);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::c_str();
      iVar1 = strcmp(pcVar2,"OPENCL");
      if (iVar1 == 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)__return_storage_ptr__,"a.cl",&local_2e);
        std::allocator<char>::~allocator((allocator<char> *)&local_2e);
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::c_str();
        iVar1 = strcmp(pcVar2,"CUDA");
        if (iVar1 == 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)__return_storage_ptr__,"a.cu",&local_2f);
          std::allocator<char>::~allocator((allocator<char> *)&local_2f);
        }
        else {
          pcVar2 = (char *)std::__cxx11::string::c_str();
          iVar1 = strcmp(pcVar2,"BANG");
          if (iVar1 == 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)__return_storage_ptr__,"a.mlu",&local_30);
            std::allocator<char>::~allocator((allocator<char> *)&local_30);
          }
          else {
            pcVar2 = (char *)std::__cxx11::string::c_str();
            iVar1 = strcmp(pcVar2,"CCE");
            if (iVar1 == 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string((string *)__return_storage_ptr__,"a.cce",&local_31);
              std::allocator<char>::~allocator((allocator<char> *)&local_31);
            }
            else {
              pcVar2 = (char *)std::__cxx11::string::c_str();
              iVar1 = strcmp(pcVar2,"TPU");
              if (iVar1 == 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)__return_storage_ptr__,"a.jl",&local_32);
                std::allocator<char>::~allocator((allocator<char> *)&local_32);
              }
              else {
                std::allocator<char>::allocator();
                std::__cxx11::string::string((string *)__return_storage_ptr__,"a.cpp",&local_33);
                std::allocator<char>::~allocator((allocator<char> *)&local_33);
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getDefaultOutputFileName(std::string &TgtLang) {
  if (!std::strcmp(TgtLang.c_str(), "OPENMP")) {
    return "a.cpp";
  } else if (!std::strcmp(TgtLang.c_str(), "NUMPY")) {
    return "a.py";
  } else if (!std::strcmp(TgtLang.c_str(), "OPENCL")) {
    return "a.cl";
  } else if (!std::strcmp(TgtLang.c_str(), "CUDA")) {
    return "a.cu";
  } else if (!std::strcmp(TgtLang.c_str(), "BANG")) {
    return "a.mlu";
  } else if (!std::strcmp(TgtLang.c_str(), "CCE")) {
    return "a.cce";
  } else if (!std::strcmp(TgtLang.c_str(), "TPU")) {
    return "a.jl";
  }
  return "a.cpp";
}